

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int int32_encode(cram_fd *fd,int32_t val)

{
  hFILE *fp;
  size_t __n;
  ulong uVar1;
  int32_t local_1c;
  
  fp = fd->fp;
  uVar1 = (long)fp->limit - (long)fp->begin;
  __n = 4;
  if (uVar1 < 4) {
    __n = uVar1;
  }
  local_1c = val;
  memcpy(fp->begin,&local_1c,__n);
  fp->begin = fp->begin + __n;
  if (uVar1 < 4) {
    __n = hwrite2(fp,&local_1c,4,__n);
  }
  return (uint)(__n == 4) * 5 + -1;
}

Assistant:

int int32_encode(cram_fd *fd, int32_t val) {
    val = le_int4(val);
    if (4 != hwrite(fd->fp, &val, 4))
	return -1;

    return 4;
}